

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::CheckIndexWithValue<wabt::SharedValidator::EventType>
          (SharedValidator *this,Var *var,
          vector<wabt::SharedValidator::EventType,_std::allocator<wabt::SharedValidator::EventType>_>
          *values,EventType *out,char *desc)

{
  Result RVar1;
  char *pcVar2;
  int __c;
  Var *__s;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_98;
  Var local_78;
  
  Var::Var(&local_78,var);
  __s = &local_78;
  RVar1 = CheckIndex(this,&local_78,
                     (Index)(((long)(values->
                                    super__Vector_base<wabt::SharedValidator::EventType,_std::allocator<wabt::SharedValidator::EventType>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(values->
                                   super__Vector_base<wabt::SharedValidator::EventType,_std::allocator<wabt::SharedValidator::EventType>_>
                                   )._M_impl.super__Vector_impl_data._M_start) / 0x18),desc);
  Var::~Var(&local_78);
  if (out != (EventType *)0x0) {
    if (RVar1.enum_ == Ok) {
      pcVar2 = Var::index(var,(char *)__s,__c);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&local_98,
                 &(values->
                  super__Vector_base<wabt::SharedValidator::EventType,_std::allocator<wabt::SharedValidator::EventType>_>
                  )._M_impl.super__Vector_impl_data._M_start[(ulong)pcVar2 & 0xffffffff].params);
    }
    else {
      local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
              (&out->params,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)&local_98);
    std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_98);
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::CheckIndexWithValue(Var var,
                                            const std::vector<T>& values,
                                            T* out,
                                            const char* desc) {
  Result result = CheckIndex(var, values.size(), desc);
  if (out) {
    *out = Succeeded(result) ? values[var.index()] : T{};
  }
  return result;
}